

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

size_t __thiscall
Logger::logful<unsigned_char>(Logger *this,logful_context_t *ctx,uint8_t **pOut,char **pMsg,uchar t)

{
  uint8_t *puVar1;
  uint uVar2;
  char *pcVar3;
  size_t __n;
  
  pcVar3 = findNextToken('%',';',&ctx->tokenFormat,*pMsg);
  __n = (long)pcVar3 - (long)*pMsg;
  memcpy(*pOut,*pMsg,__n);
  *pMsg = *pMsg + (ctx->tokenFormat)._M_string_length + __n + 1;
  puVar1 = *pOut;
  *pOut = puVar1 + __n;
  if (pcVar3 == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = sprintf((char *)(puVar1 + __n),(ctx->tokenFormat)._M_dataplus._M_p,(ulong)t);
    if (0 < (int)uVar2) {
      *pOut = *pOut + uVar2;
    }
  }
  return __n + (long)(int)uVar2;
}

Assistant:

size_t logful(logful_context_t& ctx, uint8_t*& pOut, const char*& pMsg, T t)
    {
        const char *nTok = findNextToken('%', ';', ctx.tokenFormat,pMsg);
        size_t sglen = uintptr_t(nTok)-uintptr_t(pMsg);
        std::memcpy(pOut, pMsg, sglen);
        pMsg += sglen + ctx.tokenFormat.size() + 1;
        pOut += sglen;
        int flen = 0;
        // std::cout << "logful(T) nTok=" << uintptr_t(nTok) << " sglen=" << sglen << "\n";

        if (nTok)
        {
            if constexpr (!std::is_same_v<T, BufferLog>)
            {
                flen = std::sprintf((char*)pOut, ctx.tokenFormat.c_str(), t);
                // std::cout << "token: " << "format: " << ctx.tokenFormat.c_str() <<  " value: " << t <<  " formatted: \"" << pOut << "\"\n";
            }
            else
            {
                auto s = toHexString((uint8_t*)t.second, t.first);
                std::memcpy(pOut, s.data(), s.size());
                flen += s.size();
            }
        }
        if (flen>0) pOut += flen;
        return sglen + flen;
    }